

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map.hh
# Opt level: O1

Roaring64Map * __thiscall roaring::Roaring64Map::operator&=(Roaring64Map *this,Roaring64Map *other)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  _Rb_tree_color _Var3;
  _Base_ptr p_Var4;
  _Bool _Var5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  _Rb_tree_header *p_Var8;
  const_iterator __position;
  bool bVar9;
  
  if (this != other) {
    __position._M_node = (this->roarings)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(this->roarings)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)__position._M_node != p_Var1) {
      p_Var2 = &(other->roarings)._M_t._M_impl.super__Rb_tree_header;
      do {
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
        _Var3 = __position._M_node[1]._M_color;
        p_Var4 = (other->roarings)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var7 = &p_Var2->_M_header;
        for (; (_Rb_tree_header *)p_Var4 != (_Rb_tree_header *)0x0;
            p_Var4 = (&p_Var4->_M_left)[bVar9]) {
          bVar9 = (_Rb_tree_color)*(size_t *)(p_Var4 + 1) < _Var3;
          if (!bVar9) {
            p_Var7 = p_Var4;
          }
        }
        p_Var8 = p_Var2;
        if (((_Rb_tree_header *)p_Var7 != p_Var2) &&
           (p_Var8 = (_Rb_tree_header *)p_Var7,
           _Var3 < (_Rb_tree_color)((_Rb_tree_header *)p_Var7)->_M_node_count)) {
          p_Var8 = p_Var2;
        }
        if (p_Var8 == p_Var2) {
LAB_00111532:
          std::
          _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
          ::_M_erase_aux((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
                          *)this,__position);
        }
        else {
          roaring_bitmap_and_inplace
                    ((roaring_bitmap_t *)&__position._M_node[1]._M_parent,
                     (roaring_bitmap_t *)(p_Var8 + 1));
          _Var5 = roaring_bitmap_is_empty((roaring_bitmap_t *)&__position._M_node[1]._M_parent);
          if (_Var5) goto LAB_00111532;
        }
        __position._M_node = p_Var6;
      } while ((_Rb_tree_header *)p_Var6 != p_Var1);
    }
  }
  return this;
}

Assistant:

Roaring64Map &operator&=(const Roaring64Map &other) {
        if (this == &other) {
            // ANDing *this with itself is a no-op.
            return *this;
        }

        // Logic table summarizing what to do when a given outer key is
        // present vs. absent from self and other.
        //
        // self     other    (self & other)  work to do
        // --------------------------------------------
        // absent   absent   empty           None
        // absent   present  empty           None
        // present  absent   empty           Erase self
        // present  present  empty or not    Intersect self with other, but
        //                                   erase self if result is empty.
        //
        // Because there is only work to do when a key is present in 'self', the
        // main for loop iterates over entries in 'self'.

        decltype(roarings.begin()) self_next;
        for (auto self_iter = roarings.begin(); self_iter != roarings.end();
             self_iter = self_next) {
            // Do the 'next' operation now, so we don't have to worry about
            // invalidation of self_iter down below with the 'erase' operation.
            self_next = std::next(self_iter);

            auto self_key = self_iter->first;
            auto &self_bitmap = self_iter->second;

            auto other_iter = other.roarings.find(self_key);
            if (other_iter == other.roarings.end()) {
                // 'other' doesn't have self_key. In the logic table above,
                // this reflects the case (self.present & other.absent).
                // So, erase self.
                roarings.erase(self_iter);
                continue;
            }

            // Both sides have self_key. In the logic table above, this reflects
            // the case (self.present & other.present). So, intersect self with
            // other.
            const auto &other_bitmap = other_iter->second;
            self_bitmap &= other_bitmap;
            if (self_bitmap.isEmpty()) {
                // ...but if intersection is empty, remove it altogether.
                roarings.erase(self_iter);
            }
        }
        return *this;
    }